

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffourl(char *url,char *urltype,char *outfile,char *tpltfile,char *compspec,int *status)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (0 < *status) {
    return *status;
  }
  if (urltype != (char *)0x0) {
    *urltype = '\0';
  }
  if (outfile != (char *)0x0) {
    *outfile = '\0';
  }
  if (tpltfile != (char *)0x0) {
    *tpltfile = '\0';
  }
  pcVar6 = url;
  if (compspec != (char *)0x0) {
    *compspec = '\0';
  }
  for (; *pcVar6 == ' '; pcVar6 = pcVar6 + 1) {
    url = url + 1;
  }
  if ((((*pcVar6 == '-') && ((pcVar6[1] & 0xdfU) == 0)) ||
      (iVar1 = strcmp(pcVar6,"stdout"), iVar1 == 0)) ||
     (iVar1 = strcmp(pcVar6,"STDOUT"), iVar1 == 0)) {
    if (urltype != (char *)0x0) {
      builtin_strncpy(urltype,"stdout://",10);
    }
  }
  else {
    pcVar2 = strstr(pcVar6,"://");
    if (pcVar2 == (char *)0x0) {
      if (urltype != (char *)0x0) {
        sVar4 = strlen(urltype);
        builtin_strncpy(urltype + sVar4,"file://",8);
      }
    }
    else {
      if (urltype != (char *)0x0) {
        if (0x10 < (long)pcVar2 - (long)url) goto LAB_0010f98d;
        strncat(urltype,pcVar6,((long)pcVar2 - (long)url) + 3);
      }
      pcVar6 = pcVar2 + 3;
    }
    pcVar2 = strchr(pcVar6,0x28);
    pcVar3 = strchr(pcVar6,0x5b);
    if (outfile != (char *)0x0) {
      pcVar5 = pcVar2;
      if ((pcVar2 == (char *)0x0) && (pcVar5 = pcVar3, pcVar3 == (char *)0x0)) {
        sVar4 = strlen(pcVar6);
        if (0x400 < sVar4) goto LAB_0010f98d;
        strcpy(outfile,pcVar6);
      }
      else {
        if (0x400 < (long)pcVar5 - (long)pcVar6) goto LAB_0010f98d;
        strncat(outfile,pcVar6,(long)pcVar5 - (long)pcVar6);
      }
    }
    if (pcVar2 != (char *)0x0) {
      pcVar2 = pcVar2 + 1;
      pcVar6 = strchr(pcVar2,0x29);
      if (pcVar6 == (char *)0x0) goto LAB_0010f98d;
      if (tpltfile != (char *)0x0) {
        if (0x400 < (long)pcVar6 - (long)pcVar2) goto LAB_0010f98d;
        strncat(tpltfile,pcVar2,(long)pcVar6 - (long)pcVar2);
      }
    }
    if (pcVar3 != (char *)0x0) {
      pcVar3 = pcVar3 + 1;
      pcVar6 = strchr(pcVar3,0x5d);
      if (pcVar6 == (char *)0x0) {
LAB_0010f98d:
        *status = 0x7d;
        return 0x7d;
      }
      if (compspec != (char *)0x0) {
        if (0x400 < (long)pcVar6 - (long)pcVar3) goto LAB_0010f98d;
        strncat(compspec,pcVar3,(long)pcVar6 - (long)pcVar3);
      }
    }
    if (((urltype != (char *)0x0 && outfile != (char *)0x0) &&
        (iVar1 = strcmp(urltype,"file://"), iVar1 == 0)) &&
       ((pcVar6 = strstr(outfile,".gz"), pcVar6 != (char *)0x0 && ((pcVar6[3] & 0xdfU) == 0)))) {
      builtin_strncpy(urltype,"compressoutfile://",0x13);
    }
  }
  return *status;
}

Assistant:

int ffourl(char *url,             /* I - full input URL   */
           char *urltype,          /* O - url type         */
           char *outfile,          /* O - base file name   */
           char *tpltfile,         /* O - template file name, if any */
           char *compspec,         /* O - compression specification, if any */
           int *status)
/*
   parse the output URL into its basic components.
*/

{ 
    char *ptr1, *ptr2, *ptr3;

    if (*status > 0)
        return(*status);

    if (urltype)
      *urltype = '\0';
    if (outfile)
      *outfile = '\0';
    if (tpltfile)
      *tpltfile = '\0';
    if (compspec)
      *compspec = '\0';

    ptr1 = url;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if ( ( (*ptr1 == '-') &&  ( *(ptr1 +1) ==  0   || *(ptr1 +1) == ' ' ) )
         ||  !strcmp(ptr1, "stdout")
         ||  !strcmp(ptr1, "STDOUT"))

         /* "-" means write to stdout;  also support "- "            */
         /* but exclude disk file names that begin with a minus sign */
         /* e.g., "-55d33m.fits"   */
    {
      if (urltype)
        strcpy(urltype, "stdout://");
    }
    else
    {
        /* not writing to stdout */
        /*  get urltype (e.g., file://, ftp://, http://, etc.)  */

        ptr2 = strstr(ptr1, "://");
        if (ptr2)                  /* copy the explicit urltype string */ 
        {
          if (urltype) {
	    if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	    {
                return(*status = URL_PARSE_ERROR); 
            }

            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
          }

          ptr1 = ptr2 + 3;
        }
        else                       /* assume file driver    */
        {
          if (urltype)
             strcat(urltype, "file://");
        }

        /* look for template file name, enclosed in parenthesis */
        ptr2 = strchr(ptr1, '('); 

        /* look for image compression parameters, enclosed in sq. brackets */
        ptr3 = strchr(ptr1, '['); 

        if (outfile)
        {
          if (ptr2) {  /* template file was specified  */
	     if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
 
             strncat(outfile, ptr1, ptr2 - ptr1);
          } else if (ptr3) {  /* compression was specified  */
	     if (ptr3 - ptr1 > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
             strncat(outfile, ptr1, ptr3 - ptr1);

          } else { /* no template file or compression */
	     if (strlen(ptr1) > FLEN_FILENAME - 1)
	     {
                return(*status = URL_PARSE_ERROR); 
             }
             strcpy(outfile, ptr1);
          }
        }


        if (ptr2)   /* template file was specified  */
        {
            ptr2++;

            ptr1 = strchr(ptr2, ')' );   /* search for closing ) */

            if (!ptr1)
            {
                return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
            }

            if (tpltfile) {
	        if (ptr1 - ptr2 > FLEN_FILENAME - 1)
	        {
                   return(*status = URL_PARSE_ERROR); 
                }
                 strncat(tpltfile, ptr2, ptr1 - ptr2);
            }
        }
        
        if (ptr3)   /* compression was specified  */
        {
            ptr3++;

            ptr1 = strchr(ptr3, ']' );   /* search for closing ] */

            if (!ptr1)
            {
                return(*status = URL_PARSE_ERROR);  /* error, no closing ] */
            }

            if (compspec) {

	        if (ptr1 - ptr3 > FLEN_FILENAME - 1)
	        {
                   return(*status = URL_PARSE_ERROR); 
                }
 
                strncat(compspec, ptr3, ptr1 - ptr3);
            }
        }

        /* check if a .gz compressed output file is to be created */
        /* by seeing if the filename ends in '.gz'   */
        if (urltype && outfile)
        {
            if (!strcmp(urltype, "file://") )
            {
                ptr1 = strstr(outfile, ".gz");
                if (ptr1)
                {    /* make sure the ".gz" is at the end of the file name */
                   ptr1 += 3;
                   if (*ptr1 ==  0  || *ptr1 == ' '  )
                      strcpy(urltype, "compressoutfile://");
                }
            }
        }
    }
    return(*status);
}